

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

BOOL VirtualFree(LPVOID lpAddress,SIZE_T dwSize,DWORD dwFreeType)

{
  int iVar1;
  BOOL BVar2;
  CPalThread *pThread;
  int *piVar3;
  PCMI p_Var4;
  void *pvVar5;
  char *pcVar6;
  void *__addr;
  BOOL BVar7;
  ulong uVar8;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0013127a;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  if (lpAddress == (LPVOID)0x0) {
LAB_00130ff7:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013127a;
    piVar3 = __errno_location();
    *piVar3 = 0x1e7;
LAB_0013100d:
    BVar7 = 0;
  }
  else if ((~dwFreeType & 0xc000) == 0) {
    BVar7 = 0;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013127a;
  }
  else {
    if ((dwFreeType & 0xc000) == 0) {
joined_r0x0013106c:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013127a;
      piVar3 = __errno_location();
      *piVar3 = 0x57;
      goto LAB_0013100d;
    }
    if ((dwFreeType >> 0xe & 1) == 0) {
      BVar7 = 1;
      if ((short)dwFreeType < 0) {
        p_Var4 = VIRTUALFindRegionInformation((UINT_PTR)lpAddress);
        if (p_Var4 == (PCMI)0x0) goto LAB_00130ff7;
        if (dwSize != 0) goto joined_r0x0013106c;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013127a;
        iVar1 = munmap((void *)p_Var4->startBoundary,p_Var4->memSize);
        if (iVar1 == 0) {
          BVar2 = VIRTUALReleaseMemory(p_Var4);
          if (BVar2 != 0) goto LAB_00131198;
          fprintf(_stderr,"] %s %s:%d","VirtualFree",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                  ,0x88a);
          pcVar6 = "Unable to remove the PCMI entry from the list.\n";
        }
        else {
          fprintf(_stderr,"] %s %s:%d","VirtualFree",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                  ,0x898);
          pcVar6 = "Unable to unmap the memory, munmap() returned an abnormal value.\n";
        }
        BVar7 = 0;
        fprintf(_stderr,pcVar6);
        piVar3 = __errno_location();
        *piVar3 = 0x54f;
      }
    }
    else {
      if (dwSize == 0) goto joined_r0x0013106c;
      __addr = (void *)((ulong)lpAddress & 0xfffffffffffff000);
      p_Var4 = VIRTUALFindRegionInformation((UINT_PTR)__addr);
      if (p_Var4 == (PCMI)0x0) {
        fprintf(_stderr,"] %s %s:%d","VirtualFree",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x826);
        pcVar6 = "Unable to locate the region information.\n";
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013127a;
        uVar8 = dwSize + 0xfff + ((ulong)lpAddress & 0xfff);
        pvVar5 = mmap64(__addr,uVar8 & 0xfffffffffffff000,0,0x32,-1,0);
        if (pvVar5 != (void *)0xffffffffffffffff) {
          VIRTUALSetAllocState
                    (0x2000,(long)__addr - p_Var4->startBoundary >> 0xc,uVar8 >> 0xc,p_Var4);
          BVar7 = 1;
          goto LAB_00131198;
        }
        fprintf(_stderr,"] %s %s:%d","VirtualFree",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x85f);
        pcVar6 = "mmap() returned an abnormal value.\n";
      }
      BVar7 = 0;
      fprintf(_stderr,pcVar6);
      piVar3 = __errno_location();
      *piVar3 = 0x54f;
    }
  }
LAB_00131198:
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar7;
  }
LAB_0013127a:
  abort();
}

Assistant:

BOOL
PALAPI
VirtualFree(
        IN LPVOID lpAddress,    /* Address of region. */
        IN SIZE_T dwSize,       /* Size of region. */
        IN DWORD dwFreeType )   /* Operation type. */
{
    BOOL bRetVal = TRUE;
    CPalThread *pthrCurrent;

    PERF_ENTRY(VirtualFree);
    ENTRY("VirtualFree(lpAddress=%p, dwSize=%u, dwFreeType=%#x)\n",
          lpAddress, dwSize, dwFreeType);

    pthrCurrent = InternalGetCurrentThread();
    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    /* Sanity Checks. */
    if ( !lpAddress )
    {
        ERROR( "lpAddress cannot be NULL. You must specify the base address of\
               regions to be de-committed. \n" );
        pthrCurrent->SetLastError( ERROR_INVALID_ADDRESS );
        bRetVal = FALSE;
        goto VirtualFreeExit;
    }

    if ( !( dwFreeType & MEM_RELEASE ) && !(dwFreeType & MEM_DECOMMIT ) )
    {
        ERROR( "dwFreeType must contain one of the following: \
               MEM_RELEASE or MEM_DECOMMIT\n" );
        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        bRetVal = FALSE;
        goto VirtualFreeExit;
    }
    /* You cannot release and decommit in one call.*/
    if ( dwFreeType & MEM_RELEASE && dwFreeType & MEM_DECOMMIT )
    {
        ERROR( "MEM_RELEASE cannot be combined with MEM_DECOMMIT.\n" );
        bRetVal = FALSE;
        goto VirtualFreeExit;
    }

    if ( dwFreeType & MEM_DECOMMIT )
    {
        UINT_PTR StartBoundary  = 0;
        SIZE_T MemSize        = 0;

        if ( dwSize == 0 )
        {
            ERROR( "dwSize cannot be 0. \n" );
            pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
            bRetVal = FALSE;
            goto VirtualFreeExit;
        }
        /*
         * A two byte range straddling 2 pages caues both pages to be either
         * released or decommitted. So round the dwSize up to the next page
         * boundary and round the lpAddress down to the next page boundary.
         */
        MemSize = (((UINT_PTR)(dwSize) + ((UINT_PTR)(lpAddress) & VIRTUAL_PAGE_MASK)
                    + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK);

        StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;

        PCMI pUnCommittedMem;
        pUnCommittedMem = VIRTUALFindRegionInformation( StartBoundary );
        if (!pUnCommittedMem)
        {
            ASSERT( "Unable to locate the region information.\n" );
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            bRetVal = FALSE;
            goto VirtualFreeExit;
        }

        TRACE( "Un-committing the following page(s) %d to %d.\n",
               StartBoundary, MemSize );

#if MMAP_DOESNOT_ALLOW_REMAP
        // if no double mapping is supported,
        // just mprotect the memory with no access
        if (mprotect((LPVOID)StartBoundary, MemSize, PROT_NONE) == 0)
#else // MMAP_DOESNOT_ALLOW_REMAP
        // Explicitly calling mmap instead of mprotect here makes it
        // that much more clear to the operating system that we no
        // longer need these pages.
#if RESERVE_FROM_BACKING_FILE
        if ( mmap( (LPVOID)StartBoundary, MemSize, PROT_NONE,
                   MAP_FIXED | MAP_PRIVATE, gBackingFile,
                   (char *) StartBoundary - (char *) gBackingBaseAddress ) !=
             MAP_FAILED )
#else   // RESERVE_FROM_BACKING_FILE
        if ( mmap( (LPVOID)StartBoundary, MemSize, PROT_NONE,
                   MAP_FIXED | MAP_ANON | MAP_PRIVATE, -1, 0 ) != MAP_FAILED )
#endif  // RESERVE_FROM_BACKING_FILE
#endif // MMAP_DOESNOT_ALLOW_REMAP
        {
#if (MMAP_ANON_IGNORES_PROTECTION && !MMAP_DOESNOT_ALLOW_REMAP)
            if (mprotect((LPVOID) StartBoundary, MemSize, PROT_NONE) != 0)
            {
                ASSERT("mprotect failed to protect the region!\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                munmap((LPVOID) StartBoundary, MemSize);
                bRetVal = FALSE;
                goto VirtualFreeExit;
            }
#endif  // MMAP_ANON_IGNORES_PROTECTION && !MMAP_DOESNOT_ALLOW_REMAP

            SIZE_T index = 0;
            SIZE_T nNumOfPagesToChange = 0;

            /* We can now commit this memory by calling VirtualAlloc().*/
            index = (StartBoundary - pUnCommittedMem->startBoundary) / VIRTUAL_PAGE_SIZE;

            nNumOfPagesToChange = MemSize / VIRTUAL_PAGE_SIZE;
            VIRTUALSetAllocState( MEM_RESERVE, index,
                                  nNumOfPagesToChange, pUnCommittedMem );
#if MMAP_DOESNOT_ALLOW_REMAP
            VIRTUALSetDirtyPages( 1, index,
                                  nNumOfPagesToChange, pUnCommittedMem );
#endif // MMAP_DOESNOT_ALLOW_REMAP

            goto VirtualFreeExit;
        }
        else
        {
            ASSERT( "mmap() returned an abnormal value.\n" );
            bRetVal = FALSE;
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            goto VirtualFreeExit;
        }
    }